

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<GraphContigger*,GraphEditor&,PairedReadsDatastore&,int,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  type_caster_generic *this_00;
  handle hVar2;
  vector<bool,_std::allocator<bool>_> *this_01;
  const_iterator pbVar3;
  reference rVar4;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 uVar5;
  type_caster_generic *in_stack_ffffffffffffff18;
  handle in_stack_ffffffffffffff20;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  const_iterator local_b8;
  _Bit_reference in_stack_ffffffffffffff50;
  undefined1 convert;
  type_caster<int,_void> *in_stack_ffffffffffffff60;
  reference local_80;
  PyObject *local_70;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  convert = in_stack_ffffffffffffff50._M_mask._7_1_;
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff10 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<GraphContigger,void>,pybind11::detail::type_caster<GraphEditor,void>,pybind11::detail::type_caster<PairedReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<GraphContigger,_void>,_pybind11::detail::type_caster<GraphEditor,_void>,_pybind11::detail::type_caster<PairedReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x45d7e9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff30,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_35 = type_caster_generic::load
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,(bool)uVar5);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<GraphContigger,void>,pybind11::detail::type_caster<GraphEditor,void>,pybind11::detail::type_caster<PairedReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<bool,void>>
                   ((tuple<pybind11::detail::type_caster<GraphContigger,_void>,_pybind11::detail::type_caster<GraphEditor,_void>,_pybind11::detail::type_caster<PairedReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<bool,_void>_>
                     *)0x45d869);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff30,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_34 = type_caster_generic::load
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                        SUB81((ulong)this >> 0x38,0));
  this_00 = (type_caster_generic *)
            std::
            get<2ul,pybind11::detail::type_caster<GraphContigger,void>,pybind11::detail::type_caster<GraphEditor,void>,pybind11::detail::type_caster<PairedReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<bool,void>>
                      ((tuple<pybind11::detail::type_caster<GraphContigger,_void>,_pybind11::detail::type_caster<GraphEditor,_void>,_pybind11::detail::type_caster<PairedReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<bool,_void>_>
                        *)0x45d8ed);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      2);
  local_70 = pvVar1->m_ptr;
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff30,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_80);
  local_33 = type_caster_generic::load
                       (this_00,in_stack_ffffffffffffff20,SUB81((ulong)this >> 0x38,0));
  std::
  get<3ul,pybind11::detail::type_caster<GraphContigger,void>,pybind11::detail::type_caster<GraphEditor,void>,pybind11::detail::type_caster<PairedReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<GraphContigger,_void>,_pybind11::detail::type_caster<GraphEditor,_void>,_pybind11::detail::type_caster<PairedReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x45d96b);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),3);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff30,(size_type)param_1);
  hVar2.m_ptr = (PyObject *)rVar4._M_p;
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff68);
  local_32 = type_caster<int,_void>::load(in_stack_ffffffffffffff60,hVar2,(bool)convert);
  this_01 = (vector<bool,_std::allocator<bool>_> *)
            std::
            get<4ul,pybind11::detail::type_caster<GraphContigger,void>,pybind11::detail::type_caster<GraphEditor,void>,pybind11::detail::type_caster<PairedReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<bool,void>>
                      ((tuple<pybind11::detail::type_caster<GraphContigger,_void>,_pybind11::detail::type_caster<GraphEditor,_void>,_pybind11::detail::type_caster<PairedReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<bool,_void>_>
                        *)0x45d9e0);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),4);
  std::vector<bool,_std::allocator<bool>_>::operator[](this_01,(size_type)param_1);
  uVar5 = (undefined1)((ulong)param_1 >> 0x38);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff50);
  hVar2.m_ptr._7_1_ = in_stack_ffffffffffffff3f;
  hVar2.m_ptr._0_7_ = in_stack_ffffffffffffff38;
  local_31 = type_caster<bool,_void>::load((type_caster<bool,_void> *)this_01,hVar2,(bool)uVar5);
  local_30._M_array = &local_35;
  local_30._M_len = 5;
  local_20 = &local_30;
  local_b8 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_b8 == pbVar3) {
      return true;
    }
    if ((*local_b8 & 1U) == 0) break;
    local_b8 = local_b8 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }